

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringlib.c
# Opt level: O0

int stringlib_isInteger(char *str)

{
  char *ptr;
  char *str_local;
  int local_4;
  
  ptr = str;
  if (*str == '\0') {
    local_4 = 0;
  }
  else {
    for (; *ptr != '\0'; ptr = ptr + 1) {
      if (((*ptr < '0') || ('9' < *ptr)) && (*ptr != '.')) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int stringlib_isInteger(char *str) {
	char *ptr = str;

	if ( *ptr == '\0' ) {
		return 0;
	}

	while ( *ptr != '\0' ) {
		if ( ( *ptr < 48 || *ptr > 57 ) && *ptr != '.' ) {
			return 0;
		}
		ptr++;
	}
	return 1;
}